

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O2

unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> __thiscall
phosg::popen_unique(phosg *this,string *command,string *mode)

{
  FILE *pFVar1;
  cannot_open_file *this_00;
  _Head_base<0UL,__IO_FILE_*,_false> extraout_RDX;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> uVar2;
  
  pFVar1 = popen((command->_M_dataplus)._M_p,(mode->_M_dataplus)._M_p);
  *(code **)this = popen_unique::anon_class_1_0_00000001::__invoke;
  *(FILE **)(this + 8) = pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    uVar2._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
    super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
    uVar2._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
    super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
    super__Tuple_impl<1UL,_void_(*)(_IO_FILE_*)>.super__Head_base<1UL,_void_(*)(_IO_FILE_*),_false>.
    _M_head_impl = (_Head_base<1UL,_void_(*)(_IO_FILE_*),_false>)
                   (_Head_base<1UL,_void_(*)(_IO_FILE_*),_false>)this;
    return (unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>)
           uVar2._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
           super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>;
  }
  this_00 = (cannot_open_file *)__cxa_allocate_exception(0x20);
  cannot_open_file::cannot_open_file(this_00,(string *)command);
  __cxa_throw(this_00,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
}

Assistant:

unique_ptr<FILE, void (*)(FILE*)> popen_unique(const string& command,
    const string& mode) {
  unique_ptr<FILE, void (*)(FILE*)> f(
      popen(command.c_str(), mode.c_str()),
      [](FILE* f) {
        pclose(f);
      });
  if (!f.get()) {
    throw cannot_open_file(command);
  }
  return f;
}